

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void * __thiscall
google::protobuf::Reflection::GetRawRepeatedField
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpptype,int ctype,
          Descriptor *desc)

{
  bool bVar1;
  CppType CVar2;
  int number;
  Descriptor *pDVar3;
  Descriptor **v1;
  Descriptor **v2;
  char *failure_msg;
  LogMessage *pLVar4;
  ExtensionSet *this_00;
  void *default_value;
  MapFieldBase *this_01;
  LogMessage local_90;
  Voidify local_79;
  Descriptor *local_78;
  Nullable<const_char_*> local_70;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  byte local_51;
  LogMessage local_50;
  Voidify local_39;
  Descriptor *local_38;
  Descriptor *desc_local;
  int ctype_local;
  CppType cpptype_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_38 = desc;
  desc_local._0_4_ = ctype;
  desc_local._4_4_ = cpptype;
  _ctype_local = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  bVar1 = FieldDescriptor::is_repeated(field);
  if (!bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,_ctype_local,"\"GetRawRepeatedField\"",
               "Field is singular; the method requires a repeated field.");
  }
  pDVar3 = FieldDescriptor::containing_type(_ctype_local);
  if (pDVar3 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,_ctype_local,"GetRawRepeatedField",
               "Field does not match message type.");
  }
  CVar2 = FieldDescriptor::cpp_type(_ctype_local);
  if ((CVar2 != desc_local._4_4_) &&
     ((CVar2 = FieldDescriptor::cpp_type(_ctype_local), CVar2 != CPPTYPE_ENUM ||
      (desc_local._4_4_ != CPPTYPE_INT32)))) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,_ctype_local,"GetRawRepeatedField",desc_local._4_4_);
  }
  if (-1 < (int)desc_local) {
    bVar1 = internal::IsMatchingCType(_ctype_local,(int)desc_local);
    local_51 = 0;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0xae2,"IsMatchingCType(field, ctype)");
      local_51 = 1;
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar4,(char (*) [17])"subtype mismatch");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar4);
    }
    if ((local_51 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_50);
    }
  }
  if (local_38 != (Descriptor *)0x0) {
    local_78 = FieldDescriptor::message_type(_ctype_local);
    v1 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::Descriptor_const*>(&local_78);
    v2 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::Descriptor_const*>(&local_38);
    local_70 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*>
                         (v1,v2,"field->message_type() == desc");
    if (local_70 != (Nullable<const_char_*>)0x0) {
      failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_70);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0xae4,failure_msg);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar4,(char (*) [22])"wrong submessage type");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_90);
    }
    local_70 = (Nullable<const_char_*>)0x0;
  }
  bVar1 = FieldDescriptor::is_extension(_ctype_local);
  if (bVar1) {
    this_00 = GetExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number(_ctype_local);
    default_value = internal::DefaultRawPtr();
    this_local = (Reflection *)
                 internal::ExtensionSet::GetRawRepeatedField(this_00,number,default_value);
  }
  else {
    bVar1 = anon_unknown_6::IsMapFieldInApi(_ctype_local);
    if (bVar1) {
      this_01 = GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                          (this,(Message *)field_local,_ctype_local);
      this_local = (Reflection *)internal::MapFieldBase::GetRepeatedField(this_01);
    }
    else {
      this_local = (Reflection *)GetRawNonOneof<char>(this,(Message *)field_local,_ctype_local);
    }
  }
  return this_local;
}

Assistant:

const void* Reflection::GetRawRepeatedField(const Message& message,
                                            const FieldDescriptor* field,
                                            FieldDescriptor::CppType cpptype,
                                            int ctype,
                                            const Descriptor* desc) const {
  USAGE_CHECK_REPEATED("GetRawRepeatedField");
  USAGE_CHECK_MESSAGE_TYPE(GetRawRepeatedField);
  if (field->cpp_type() != cpptype &&
      (field->cpp_type() != FieldDescriptor::CPPTYPE_ENUM ||
       cpptype != FieldDescriptor::CPPTYPE_INT32))
    ReportReflectionUsageTypeError(descriptor_, field, "GetRawRepeatedField",
                                   cpptype);
  if (ctype >= 0)
    ABSL_CHECK(IsMatchingCType(field, ctype)) << "subtype mismatch";
  if (desc != nullptr)
    ABSL_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRawRepeatedField(
        field->number(), internal::DefaultRawPtr());
  } else {
    // Trigger transform for MapField
    if (IsMapFieldInApi(field)) {
      return &(GetRawNonOneof<MapFieldBase>(message, field).GetRepeatedField());
    }
    return &GetRawNonOneof<char>(message, field);
  }
}